

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeModifyAssignment(ExpressionContext *ctx,SynModifyAssignment *syntax)

{
  SynBase *source;
  Lexeme *pLVar1;
  FunctionLookupChain chain;
  FunctionLookupChain chain_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  SynBinaryOpType SVar5;
  SynBase *arg0;
  TypeBase *pTVar6;
  char *__s;
  size_t sVar7;
  ExprBase *pEVar8;
  undefined4 extraout_var;
  TypeRef *type;
  VariableHandle *variable;
  undefined4 extraout_var_01;
  SynBase *pSVar9;
  VariableData *pVVar10;
  ExprBase *first;
  _func_int **pp_Var11;
  undefined4 extraout_var_04;
  ExprBase *pEVar12;
  undefined4 extraout_var_05;
  ExprBase *pEVar13;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TypeBase *pTVar14;
  undefined4 extraout_var_08;
  ExprBase *unaff_R13;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  TypePair typePair;
  FunctionLookupChain function_1;
  FunctionLookupChain function;
  SmallArray<ArgumentData,_1U> arguments;
  TypePair local_e8;
  FunctionLookupChain local_d8;
  FunctionLookupChain local_c0;
  SmallArray<ArgumentData,_1U> local_a8;
  ArgumentData local_60;
  SynBase *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  arg0 = (SynBase *)AnalyzeExpression(ctx,syntax->lhs);
  pTVar6 = (TypeBase *)AnalyzeExpression(ctx,syntax->rhs);
  local_e8.a = (TypeBase *)arg0->end;
  if (((local_e8.a != (TypeBase *)0x0) && ((local_e8.a)->typeID == 0)) ||
     ((local_e8.b = (TypeBase *)(pTVar6->name).end, local_e8.b != (TypeBase *)0x0 &&
      ((local_e8.b)->typeID == 0)))) {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
    pTVar14 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar8->typeID = 0;
    pEVar8->source = &syntax->super_SynBase;
    pEVar8->type = pTVar14;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprError_003f6638;
    pEVar8[2]._vptr_ExprBase = (_func_int **)0x0;
    pEVar8[1]._vptr_ExprBase = (_func_int **)&pEVar8[1].source;
    pEVar8[1].source = arg0;
    *(undefined8 *)&pEVar8[1].typeID = 0x400000002;
    pEVar8[1].type = pTVar6;
    return pEVar8;
  }
  uVar3 = *(int *)&(syntax->super_SynBase).field_0x3c - 1;
  if (10 < uVar3) {
LAB_001f2efd:
    __assert_fail("index < N",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x115,
                  "T &FixedArray<SmallDenseSet<TypePair, TypePairHasher, 4>, 11>::operator[](unsigned int) [T = SmallDenseSet<TypePair, TypePairHasher, 4>, N = 11]"
                 );
  }
  bVar2 = SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains
                    ((ctx->noModifyOperatorForTypePair).data + uVar3,&local_e8);
  if (!bVar2) {
    __s = GetOpName(*(SynModifyAssignType *)&(syntax->super_SynBase).field_0x3c);
    sVar7 = strlen(__s);
    name.end = __s + sVar7;
    name.begin = __s;
    pEVar8 = CreateFunctionCall2(ctx,&syntax->super_SynBase,name,(ExprBase *)arg0,(ExprBase *)pTVar6
                                 ,true,false,true);
    if (pEVar8 != (ExprBase *)0x0) {
      return pEVar8;
    }
    uVar3 = *(int *)&(syntax->super_SynBase).field_0x3c - 1;
    if (10 < uVar3) goto LAB_001f2efd;
    SmallDenseSet<TypePair,_TypePairHasher,_4U>::insert
              ((ctx->noModifyOperatorForTypePair).data + uVar3,&local_e8);
    unaff_R13 = (ExprBase *)0x0;
  }
  if ((arg0 == (SynBase *)0x0) || (pSVar9 = arg0, arg0->typeID != 0x22)) {
    pSVar9 = (SynBase *)0x0;
  }
  if (pSVar9 == (SynBase *)0x0) {
    if ((arg0 == (SynBase *)0x0) || (pSVar9 = arg0, arg0->typeID != 0x16)) {
      pSVar9 = (SynBase *)0x0;
    }
    if (pSVar9 == (SynBase *)0x0) {
      if ((arg0 == (SynBase *)0x0) || (pSVar9 = arg0, arg0->typeID != 0x29)) {
        pSVar9 = (SynBase *)0x0;
      }
      bVar2 = true;
      this = arg0;
      if (pSVar9 != (SynBase *)0x0) {
        pSVar9 = pSVar9->next;
        if ((pSVar9 == (SynBase *)0x0) || (pSVar9->typeID != 0x26)) {
          pSVar9 = (SynBase *)0x0;
        }
        if (((pSVar9 != (SynBase *)0x0) && (pSVar9->next != (SynBase *)0x0)) &&
           (*(char *)((long)&(pSVar9->next->pos).begin + 1) == '\x01')) {
          SVar5 = anon_unknown.dwarf_11255e::GetBinaryOpType
                            (*(SynModifyAssignType *)&(syntax->super_SynBase).field_0x3c);
          pEVar8 = CreateBinaryOp(ctx,&syntax->super_SynBase,SVar5,(ExprBase *)arg0,
                                  (ExprBase *)pTVar6);
          if ((pEVar8->type == (TypeBase *)0x0) || (pEVar8->type->typeID != 0)) {
            local_a8.allocator = ctx->allocator;
            local_a8.data = local_a8.little;
            local_a8.little[0].source = (SynBase *)0x0;
            local_a8.little[0].isExplicit = false;
            local_a8.little[0].name = (SynIdentifier *)0x0;
            local_a8.little[0].type = (TypeBase *)0x0;
            local_a8.little[0].value = (ExprBase *)0x0;
            local_a8.little[0].valueFunction = (FunctionData *)0x0;
            local_a8.count = 0;
            local_a8.max = 1;
            local_60.type = pEVar8->type;
            local_60.isExplicit = false;
            local_60.name = (SynIdentifier *)0x0;
            local_60.valueFunction = (FunctionData *)0x0;
            local_60.source = &syntax->super_SynBase;
            local_60.value = pEVar8;
            SmallArray<ArgumentData,_1U>::push_back(&local_a8,&local_60);
            anon_unknown.dwarf_11255e::LookupFunctionChainByName
                      (&local_c0,ctx,*(uint *)&pSVar9->next[1]._vptr_SynBase);
            if (local_c0.node.node == (Node *)0x0) {
              bVar2 = true;
            }
            else {
              chain.node.node._0_4_ = (int)local_c0.node.node;
              chain.node.start = local_c0.node.start;
              chain.node.node._4_4_ = (int)((ulong)local_c0.node.node >> 0x20);
              chain.scope._0_4_ = (int)local_c0.scope;
              chain.scope._4_4_ = (int)((ulong)local_c0.scope >> 0x20);
              pEVar8 = CreateFunctionAccess
                                 (ctx,&syntax->super_SynBase,chain,*(ExprBase **)&pSVar9->listed);
              arguments_00.count = local_a8.count;
              arguments_00.data = local_a8.data;
              arguments_00._12_4_ = 0;
              pEVar8 = CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar8,arguments_00,true);
              bVar2 = pEVar8 == (ExprBase *)0x0;
              if (!bVar2) {
                unaff_R13 = pEVar8;
              }
            }
            if (bVar2) {
              pLVar1 = pSVar9->next[5].end;
              bVar2 = true;
              if ((pLVar1 != (Lexeme *)0x0) &&
                 (anon_unknown.dwarf_11255e::LookupFunctionChainByName(&local_d8,ctx,pLVar1[2].type)
                 , local_d8.node.node != (Node *)0x0)) {
                chain_00.node.node._0_4_ = (int)local_d8.node.node;
                chain_00.node.start = local_d8.node.start;
                chain_00.node.node._4_4_ = (int)((ulong)local_d8.node.node >> 0x20);
                chain_00.scope._0_4_ = (int)local_d8.scope;
                chain_00.scope._4_4_ = (int)((ulong)local_d8.scope >> 0x20);
                pEVar8 = CreateFunctionAccess
                                   (ctx,&syntax->super_SynBase,chain_00,
                                    *(ExprBase **)&pSVar9->listed);
                arguments_01.count = local_a8.count;
                arguments_01.data = local_a8.data;
                arguments_01._12_4_ = 0;
                pEVar8 = CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar8,arguments_01,true);
                bVar2 = pEVar8 == (ExprBase *)0x0;
                if (!bVar2) {
                  unaff_R13 = pEVar8;
                }
              }
            }
            else {
              bVar2 = false;
            }
            SmallArray<ArgumentData,_1U>::~SmallArray(&local_a8);
          }
          else {
            iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
            unaff_R13 = (ExprBase *)CONCAT44(extraout_var_08,iVar4);
            pTVar14 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
            unaff_R13->typeID = 0;
            unaff_R13->source = &syntax->super_SynBase;
            unaff_R13->type = pTVar14;
            bVar2 = false;
            unaff_R13->next = (ExprBase *)0x0;
            unaff_R13->listed = false;
            unaff_R13->_vptr_ExprBase = (_func_int **)&PTR__ExprError_003f6638;
            unaff_R13[2]._vptr_ExprBase = (_func_int **)0x0;
            unaff_R13[1]._vptr_ExprBase = (_func_int **)&unaff_R13[1].source;
            unaff_R13[1].source = arg0;
            *(undefined8 *)&unaff_R13[1].typeID = 0x400000002;
            unaff_R13[1].type = pTVar6;
          }
        }
      }
      goto LAB_001f2954;
    }
    this = pSVar9->next;
  }
  else {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    this = (SynBase *)CONCAT44(extraout_var,iVar4);
    source = (SynBase *)arg0->begin;
    type = ExpressionContext::GetReferenceType(ctx,(TypeBase *)arg0->end);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    variable = (VariableHandle *)CONCAT44(extraout_var_00,iVar4);
    pVVar10 = (VariableData *)pSVar9->next;
    variable->source = (SynBase *)pSVar9->begin;
    variable->variable = pVVar10;
    variable->next = (VariableHandle *)0x0;
    variable->listed = false;
    ExprGetAddress::ExprGetAddress((ExprGetAddress *)this,source,&type->super_TypeBase,variable);
  }
  bVar2 = true;
LAB_001f2954:
  if (bVar2) {
    pTVar14 = (TypeBase *)this->end;
    if ((pTVar14 == (TypeBase *)0x0) || (pTVar14->typeID != 0x12)) {
      anon_unknown.dwarf_11255e::Report
                (ctx,&syntax->super_SynBase,"ERROR: cannot change immutable value of type %.*s",
                 (ulong)(uint)(*(int *)&(((TypeBase *)arg0->end)->name).end -
                              (int)(((TypeBase *)arg0->end)->name).begin));
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      unaff_R13 = (ExprBase *)CONCAT44(extraout_var_06,iVar4);
      pTVar14 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      unaff_R13->typeID = 0;
      unaff_R13->source = &syntax->super_SynBase;
      unaff_R13->type = pTVar14;
      unaff_R13->next = (ExprBase *)0x0;
      unaff_R13->listed = false;
      unaff_R13->_vptr_ExprBase = (_func_int **)&PTR__ExprError_003f6638;
      unaff_R13[2]._vptr_ExprBase = (_func_int **)0x0;
      unaff_R13[1]._vptr_ExprBase = (_func_int **)&unaff_R13[1].source;
      unaff_R13[1].source = arg0;
      *(undefined8 *)&unaff_R13[1].typeID = 0x400000002;
      unaff_R13[1].type = pTVar6;
    }
    else {
      pVVar10 = anon_unknown.dwarf_11255e::AllocateTemporary(ctx,&syntax->super_SynBase,pTVar14);
      SVar5 = SYN_BINARY_OP_UNKNOWN;
      pEVar8 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar10,false);
      pEVar8 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar8,(ExprBase *)this);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      first = (ExprBase *)CONCAT44(extraout_var_02,iVar4);
      pTVar14 = ctx->typeVoid;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var11 = (_func_int **)CONCAT44(extraout_var_03,iVar4);
      *pp_Var11 = (_func_int *)0x0;
      pp_Var11[1] = (_func_int *)pVVar10;
      pp_Var11[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var11 + 3) = 0;
      first->typeID = 0x1e;
      first->source = &syntax->super_SynBase;
      first->type = pTVar14;
      first->next = (ExprBase *)0x0;
      first->listed = false;
      first->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f64e8;
      first[1]._vptr_ExprBase = pp_Var11;
      *(ExprBase **)&first[1].typeID = pEVar8;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_04,iVar4);
      pTVar14 = (TypeBase *)arg0->end;
      pEVar12 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar10,false);
      pEVar8->typeID = 0x16;
      pEVar8->source = &syntax->super_SynBase;
      pEVar8->type = pTVar14;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6520;
      pEVar8[1]._vptr_ExprBase = (_func_int **)pEVar12;
      uVar3 = *(int *)&(syntax->super_SynBase).field_0x3c - 1;
      if (uVar3 < 0xb) {
        SVar5 = *(SynBinaryOpType *)(&DAT_0034f0ac + (ulong)uVar3 * 4);
      }
      pEVar8 = CreateBinaryOp(ctx,&syntax->super_SynBase,SVar5,pEVar8,(ExprBase *)pTVar6);
      if ((pEVar8->type == (TypeBase *)0x0) || (pEVar8->type->typeID != 0)) {
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar12 = (ExprBase *)CONCAT44(extraout_var_05,iVar4);
        pTVar6 = (TypeBase *)arg0->end;
        pEVar13 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar10,false);
        pEVar12->typeID = 0x16;
        pEVar12->source = &syntax->super_SynBase;
        pEVar12->type = pTVar6;
        pEVar12->next = (ExprBase *)0x0;
        pEVar12->listed = false;
        pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6520;
        pEVar12[1]._vptr_ExprBase = (_func_int **)pEVar13;
        pEVar8 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar12,pEVar8);
        unaff_R13 = CreateSequence(ctx,&syntax->super_SynBase,first,pEVar8);
      }
      else {
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        unaff_R13 = (ExprBase *)CONCAT44(extraout_var_07,iVar4);
        pTVar14 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        unaff_R13->typeID = 0;
        unaff_R13->source = &syntax->super_SynBase;
        unaff_R13->type = pTVar14;
        unaff_R13->next = (ExprBase *)0x0;
        unaff_R13->listed = false;
        unaff_R13->_vptr_ExprBase = (_func_int **)&PTR__ExprError_003f6638;
        unaff_R13[2]._vptr_ExprBase = (_func_int **)0x0;
        unaff_R13[1]._vptr_ExprBase = (_func_int **)&unaff_R13[1].source;
        unaff_R13[1].source = arg0;
        *(undefined8 *)&unaff_R13[1].typeID = 0x400000002;
        unaff_R13[1].type = pTVar6;
      }
    }
  }
  return unaff_R13;
}

Assistant:

ExprBase* AnalyzeModifyAssignment(ExpressionContext &ctx, SynModifyAssignment *syntax)
{
	ExprBase *lhs = AnalyzeExpression(ctx, syntax->lhs);
	ExprBase *rhs = AnalyzeExpression(ctx, syntax->rhs);

	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

	TypePair typePair(lhs->type, rhs->type);

	if(!ctx.noModifyOperatorForTypePair[int(syntax->type) - 1].contains(typePair))
	{
		if(ExprBase *result = CreateFunctionCall2(ctx, syntax, InplaceStr(GetOpName(syntax->type)), lhs, rhs, true, false, true))
			return result;
		else
			ctx.noModifyOperatorForTypePair[int(syntax->type) - 1].insert(typePair);
	}

	// Unwrap modifiable pointer
	ExprBase* wrapped = lhs;

	if(ExprVariableAccess *node = getType<ExprVariableAccess>(lhs))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(lhs->source, ctx.GetReferenceType(lhs->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(lhs))
	{
		wrapped = node->value;
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(lhs))
	{
		// Will try to transform 'get' accessor to 'set'
		if(ExprFunctionAccess *access = getType<ExprFunctionAccess>(node->function))
		{
			if(access->function && access->function->accessor)
			{
				ExprBase *result = CreateBinaryOp(ctx, syntax, GetBinaryOpType(syntax->type), lhs, rhs);

				if(isType<TypeError>(result->type))
					return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

				SmallArray<ArgumentData, 1> arguments(ctx.allocator);
				arguments.push_back(ArgumentData(syntax, false, NULL, result->type, result));

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, access->function->nameHash))
				{
					ExprBase *overloads = CreateFunctionAccess(ctx, syntax, function, access->context);

					if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, arguments, true))
						return call;
				}

				if(FunctionData *proto = access->function->proto)
				{
					if(FunctionLookupChain function = LookupFunctionChainByName(ctx, proto->nameHash))
					{
						ExprBase *overloads = CreateFunctionAccess(ctx, syntax, function, access->context);

						if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, arguments, true))
							return call;
					}
				}
			}
		}
	}

	TypeRef *typeRef = getType<TypeRef>(wrapped->type);

	if(!typeRef)
	{
		Report(ctx, syntax, "ERROR: cannot change immutable value of type %.*s", FMT_ISTR(lhs->type->name));

		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);
	}

	VariableData *storage = AllocateTemporary(ctx, syntax, wrapped->type);

	ExprBase *assignment = CreateAssignment(ctx, syntax, CreateVariableAccess(ctx, syntax, storage, false), wrapped);

	ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

	ExprBase *lhsValue = new (ctx.get<ExprDereference>()) ExprDereference(syntax, lhs->type, CreateVariableAccess(ctx, syntax, storage, false));

	ExprBase *result = CreateBinaryOp(ctx, syntax, GetBinaryOpType(syntax->type), lhsValue, rhs);

	if(isType<TypeError>(result->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

	return CreateSequence(ctx, syntax, definition, CreateAssignment(ctx, syntax, new (ctx.get<ExprDereference>()) ExprDereference(syntax, lhs->type, CreateVariableAccess(ctx, syntax, storage, false)), result));
}